

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Scrollbar(ImGuiAxis axis)

{
  ImGuiWindow *window_00;
  ImGuiID id_00;
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  undefined1 local_64 [8];
  ImRect bb;
  ImDrawCornerFlags rounding_corners;
  float other_scrollbar_size;
  float scrollbar_size;
  float border_size;
  ImRect inner_rect;
  ImRect outer_rect;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiAxis axis_local;
  
  window_00 = GImGui->CurrentWindow;
  id_00 = GetWindowScrollbarID(window_00,axis);
  KeepAliveID(id_00);
  join_0x00001240_0x00001200_ = ImGuiWindow::Rect(window_00);
  _scrollbar_size = (window_00->InnerRect).Min;
  inner_rect.Min = (window_00->InnerRect).Max;
  fVar5 = window_00->WindowBorderSize;
  pfVar2 = ImVec2::operator[](&window_00->ScrollbarSizes,(long)(axis ^ ImGuiAxis_Y));
  fVar6 = *pfVar2;
  if (0.0 < fVar6) {
    pfVar2 = ImVec2::operator[](&window_00->ScrollbarSizes,(long)axis);
    bb.Max.y = *pfVar2;
    bb.Max.x = 0.0;
    if (bb.Max.y <= 0.0) {
      bb.Max.x = 1.12104e-44;
    }
    ImRect::ImRect((ImRect *)local_64);
    if (axis == ImGuiAxis_X) {
      fVar7 = scrollbar_size;
      fVar5 = ImMax<float>(inner_rect.Max.y,(outer_rect.Min.y - fVar5) - fVar6);
      ImVec2::ImVec2(&local_6c,fVar7,fVar5);
      local_64._0_4_ = local_6c.x;
      local_64._4_4_ = local_6c.y;
      ImVec2::ImVec2(&local_74,inner_rect.Min.x,outer_rect.Min.y);
      bb.Min = local_74;
      bb.Max.x = (float)((uint)bb.Max.x | 4);
    }
    else {
      fVar5 = ImMax<float>(inner_rect.Max.x,(outer_rect.Min.x - fVar5) - fVar6);
      ImVec2::ImVec2(&local_7c,fVar5,border_size);
      local_64._0_4_ = local_7c.x;
      local_64._4_4_ = local_7c.y;
      ImVec2::ImVec2(&local_84,outer_rect.Min.x,(window_00->InnerRect).Max.y);
      bb.Min = local_84;
      bVar4 = false;
      if ((window_00->Flags & 1U) != 0) {
        bVar4 = (window_00->Flags & 0x400U) == 0;
      }
      uVar1 = 0;
      if (bVar4) {
        uVar1 = 2;
      }
      bb.Max.x = (float)(uVar1 | (uint)bb.Max.x);
    }
    pfVar2 = ImVec2::operator[](&window_00->Scroll,(long)axis);
    fVar6 = ImVec2::operator[](&inner_rect.Min,(long)axis);
    fVar7 = ImVec2::operator[]((ImVec2 *)&scrollbar_size,(long)axis);
    pfVar3 = ImVec2::operator[](&window_00->ContentSize,(long)axis);
    fVar5 = *pfVar3;
    pfVar3 = ImVec2::operator[](&window_00->WindowPadding,(long)axis);
    ScrollbarEx((ImRect *)local_64,id_00,axis,pfVar2,fVar6 - fVar7,*pfVar3 + *pfVar3 + fVar5,
                (ImDrawCornerFlags)bb.Max.x);
    return;
  }
  __assert_fail("scrollbar_size > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                ,0x39d,"void ImGui::Scrollbar(ImGuiAxis)");
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1];
    IM_ASSERT(scrollbar_size > 0.0f);
    const float other_scrollbar_size = window->ScrollbarSizes[axis];
    ImDrawCornerFlags rounding_corners = (other_scrollbar_size <= 0.0f) ? ImDrawCornerFlags_BotRight : 0;
    ImRect bb;
    if (axis == ImGuiAxis_X)
    {
        bb.Min = ImVec2(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size));
        bb.Max = ImVec2(inner_rect.Max.x, outer_rect.Max.y);
        rounding_corners |= ImDrawCornerFlags_BotLeft;
    }
    else
    {
        bb.Min = ImVec2(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y);
        bb.Max = ImVec2(outer_rect.Max.x, window->InnerRect.Max.y);
        rounding_corners |= ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0;
    }
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], inner_rect.Max[axis] - inner_rect.Min[axis], window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f, rounding_corners);
}